

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathEuler.h
# Opt level: O1

void __thiscall Imath_3_2::Euler<float>::extract(Euler<float> *this,Matrix44<float> *M)

{
  byte bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float local_f8 [4];
  float local_e8 [22];
  long local_90;
  long local_88;
  float local_7c;
  float local_78;
  float local_68;
  float local_58;
  float local_48;
  
  bVar1 = this->field_0xc;
  uVar14 = bVar1 >> 3 & 3;
  if ((bVar1 & 4) == 0) {
    uVar10 = 2;
    if ((char)uVar14 != '\0') {
      uVar10 = uVar14 - 1;
    }
  }
  else {
    uVar10 = (uVar14 + 1) % 3;
  }
  if ((bVar1 & 4) == 0) {
    uVar11 = (uVar14 + 1) % 3;
  }
  else {
    uVar11 = 2;
    if ((char)uVar14 != '\0') {
      uVar11 = uVar14 - 1;
    }
  }
  lVar15 = (long)(int)uVar10;
  local_88 = lVar15;
  if ((bVar1 & 2) == 0) {
    lVar12 = (long)(int)uVar11;
    fVar16 = atan2f(M->x[lVar15][lVar12],*(float *)((long)M->x + lVar12 * 0x14));
    (this->super_Vec3<float>).x = fVar16;
    local_f8[0] = 0.0;
    local_f8[1] = 0.0;
    local_f8[2] = 0.0;
    if ((this->field_0xc & 4) != 0) {
      fVar16 = -fVar16;
    }
    *(float *)((long)local_f8 + (ulong)(uVar14 * 4)) = fVar16;
    local_e8[0] = 1.0;
    local_e8[1] = 0.0;
    local_e8[2] = 0.0;
    local_e8[3] = 0.0;
    local_e8[4] = 0.0;
    local_e8[5] = 1.0;
    local_e8[6] = 0.0;
    local_e8[7] = 0.0;
    local_e8[8] = 0.0;
    local_e8[9] = 0.0;
    local_e8[10] = 1.0;
    local_e8[0xb] = 0.0;
    local_e8[0xc] = 0.0;
    local_e8[0xd] = 0.0;
    local_e8[0xe] = 0.0;
    local_e8[0xf] = 1.0;
    local_68 = local_f8[2];
    fVar16 = cosf(local_f8[2]);
    local_90 = CONCAT44(local_90._4_4_,fVar16);
    local_e8[0x10] = local_f8[1];
    local_48 = cosf(local_f8[1]);
    local_78 = local_f8[0];
    local_58 = cosf(local_f8[0]);
    local_68 = sinf(local_68);
    local_e8[0x10] = sinf(local_e8[0x10]);
    fVar16 = sinf(local_78);
    lVar9 = local_88;
    fVar17 = (float)local_90 * local_48;
    fVar29 = local_48 * local_68;
    fVar28 = (float)local_90 * local_e8[0x10] * fVar16 - local_68 * local_58;
    fVar30 = (float)local_90 * local_58 + local_68 * local_e8[0x10] * fVar16;
    fVar23 = local_48 * fVar16;
    fVar36 = local_68 * fVar16 + local_58 * (float)local_90 * local_e8[0x10];
    fVar16 = local_58 * local_68 * local_e8[0x10] - (float)local_90 * fVar16;
    fVar35 = local_48 * local_58;
    fVar18 = (fVar17 * local_e8[0] + fVar29 * local_e8[4]) - local_e8[0x10] * local_e8[8];
    fVar19 = (fVar17 * local_e8[1] + fVar29 * local_e8[5]) - local_e8[0x10] * local_e8[9];
    fVar21 = (fVar17 * local_e8[2] + fVar29 * local_e8[6]) - local_e8[0x10] * local_e8[10];
    fVar22 = (fVar17 * local_e8[3] + fVar29 * local_e8[7]) - local_e8[0x10] * local_e8[0xb];
    fVar24 = fVar23 * local_e8[8] + fVar28 * local_e8[0] + fVar30 * local_e8[4];
    fVar25 = fVar23 * local_e8[9] + fVar28 * local_e8[1] + fVar30 * local_e8[5];
    fVar26 = fVar23 * local_e8[10] + fVar28 * local_e8[2] + fVar30 * local_e8[6];
    fVar27 = fVar23 * local_e8[0xb] + fVar28 * local_e8[3] + fVar30 * local_e8[7];
    fVar31 = fVar35 * local_e8[8] + fVar36 * local_e8[0] + fVar16 * local_e8[4];
    fVar32 = fVar35 * local_e8[9] + fVar36 * local_e8[1] + fVar16 * local_e8[5];
    fVar33 = fVar35 * local_e8[10] + fVar36 * local_e8[2] + fVar16 * local_e8[6];
    fVar34 = fVar35 * local_e8[0xb] + fVar36 * local_e8[3] + fVar16 * local_e8[7];
    fVar16 = M->x[0][0];
    fVar17 = M->x[0][1];
    fVar23 = M->x[0][2];
    fVar28 = M->x[0][3];
    fVar29 = M->x[1][0];
    fVar30 = M->x[1][1];
    fVar35 = M->x[1][2];
    fVar36 = M->x[1][3];
    fVar2 = M->x[2][0];
    fVar20 = M->x[2][1];
    fVar3 = M->x[2][2];
    fVar4 = M->x[2][3];
    fVar5 = M->x[3][0];
    fVar6 = M->x[3][1];
    fVar7 = M->x[3][2];
    fVar8 = M->x[3][3];
    local_e8[0] = fVar22 * fVar5 + fVar21 * fVar2 + fVar18 * fVar16 + fVar19 * fVar29;
    local_e8[2] = fVar22 * fVar7 + fVar21 * fVar3 + fVar18 * fVar23 + fVar19 * fVar35;
    local_e8[1] = fVar22 * fVar6 + fVar21 * fVar20 + fVar18 * fVar17 + fVar19 * fVar30;
    local_e8[4] = fVar27 * fVar5 + fVar26 * fVar2 + fVar24 * fVar16 + fVar25 * fVar29;
    local_e8[3] = fVar22 * fVar8 + fVar21 * fVar4 + fVar18 * fVar28 + fVar19 * fVar36;
    local_e8[5] = fVar27 * fVar6 + fVar26 * fVar20 + fVar24 * fVar17 + fVar25 * fVar30;
    local_e8[7] = fVar27 * fVar8 + fVar26 * fVar4 + fVar24 * fVar28 + fVar25 * fVar36;
    local_e8[6] = fVar27 * fVar7 + fVar26 * fVar3 + fVar24 * fVar23 + fVar25 * fVar35;
    local_e8[9] = fVar34 * fVar6 + fVar33 * fVar20 + fVar31 * fVar17 + fVar32 * fVar30;
    local_e8[8] = fVar34 * fVar5 + fVar33 * fVar2 + fVar31 * fVar16 + fVar32 * fVar29;
    local_e8[10] = fVar34 * fVar7 + fVar33 * fVar3 + fVar31 * fVar23 + fVar32 * fVar35;
    fVar19 = local_e8[0xd] * fVar36;
    fVar17 = local_e8[0xc] * fVar17;
    fVar23 = local_e8[0xc] * fVar23;
    fVar18 = local_e8[0xc] * fVar28;
    fVar20 = local_e8[0xe] * fVar20;
    fVar21 = local_e8[0xe] * fVar4;
    local_e8[0xc] =
         local_e8[0xf] * fVar5 +
         local_e8[0xe] * fVar2 + local_e8[0xc] * fVar16 + local_e8[0xd] * fVar29;
    local_e8[0xb] = fVar34 * fVar8 + fVar33 * fVar4 + fVar31 * fVar28 + fVar32 * fVar36;
    local_e8[0xe] = local_e8[0xf] * fVar7 + local_e8[0xe] * fVar3 + fVar23 + local_e8[0xd] * fVar35;
    local_e8[0xd] = local_e8[0xf] * fVar6 + fVar20 + fVar17 + local_e8[0xd] * fVar30;
    local_e8[0xf] = local_e8[0xf] * fVar8 + fVar21 + fVar18 + fVar19;
    uVar10 = uVar14 << 4;
    fVar16 = *(float *)((long)local_e8 + (ulong)(uVar14 * 4) + (ulong)uVar10);
    fVar17 = *(float *)((long)local_e8 + local_88 * 4 + (ulong)uVar10);
    fVar16 = fVar16 * fVar16 + fVar17 * fVar17;
    if (fVar16 < 0.0) {
      fVar16 = sqrtf(fVar16);
    }
    else {
      fVar16 = SQRT(fVar16);
    }
    fVar16 = atan2f(-*(float *)((long)local_e8 + lVar12 * 4 + (ulong)uVar10),fVar16);
    (this->super_Vec3<float>).y = fVar16;
    fVar17 = -local_e8[lVar15 * 4 + (ulong)uVar14];
    fVar16 = local_e8[lVar15 * 4 + lVar9];
  }
  else {
    uVar13 = (ulong)(uVar14 * 4);
    local_90 = (long)(int)uVar11;
    lVar12 = local_90 * 0x10;
    fVar16 = atan2f(*(float *)((long)M->x[lVar15] + uVar13),
                    *(float *)((long)M->x[local_90] + uVar13));
    (this->super_Vec3<float>).x = fVar16;
    local_f8[0] = 0.0;
    local_f8[1] = 0.0;
    local_f8[2] = 0.0;
    if ((this->field_0xc & 4) != 0) {
      fVar16 = -fVar16;
    }
    *(float *)((long)local_f8 + uVar13) = fVar16;
    local_e8[0] = 1.0;
    local_e8[1] = 0.0;
    local_e8[2] = 0.0;
    local_e8[3] = 0.0;
    local_e8[4] = 0.0;
    local_e8[5] = 1.0;
    local_e8[6] = 0.0;
    local_e8[7] = 0.0;
    local_e8[8] = 0.0;
    local_e8[9] = 0.0;
    local_e8[10] = 1.0;
    local_e8[0xb] = 0.0;
    local_e8[0xc] = 0.0;
    local_e8[0xd] = 0.0;
    local_e8[0xe] = 0.0;
    local_e8[0xf] = 1.0;
    local_e8[0x10] = local_f8[2];
    local_48 = cosf(local_f8[2]);
    local_78 = local_f8[1];
    local_58 = cosf(local_f8[1]);
    local_7c = local_f8[0];
    local_68 = cosf(local_f8[0]);
    local_e8[0x10] = sinf(local_e8[0x10]);
    local_78 = sinf(local_78);
    fVar16 = sinf(local_7c);
    fVar17 = local_48 * local_58;
    fVar29 = local_58 * local_e8[0x10];
    fVar28 = local_48 * local_78 * fVar16 - local_e8[0x10] * local_68;
    fVar30 = local_48 * local_68 + local_e8[0x10] * local_78 * fVar16;
    fVar23 = local_58 * fVar16;
    fVar36 = local_e8[0x10] * fVar16 + local_68 * local_48 * local_78;
    fVar16 = local_68 * local_e8[0x10] * local_78 - local_48 * fVar16;
    fVar35 = local_58 * local_68;
    fVar18 = (fVar17 * local_e8[0] + fVar29 * local_e8[4]) - local_78 * local_e8[8];
    fVar19 = (fVar17 * local_e8[1] + fVar29 * local_e8[5]) - local_78 * local_e8[9];
    fVar21 = (fVar17 * local_e8[2] + fVar29 * local_e8[6]) - local_78 * local_e8[10];
    fVar22 = (fVar17 * local_e8[3] + fVar29 * local_e8[7]) - local_78 * local_e8[0xb];
    fVar24 = fVar23 * local_e8[8] + fVar28 * local_e8[0] + fVar30 * local_e8[4];
    fVar25 = fVar23 * local_e8[9] + fVar28 * local_e8[1] + fVar30 * local_e8[5];
    fVar26 = fVar23 * local_e8[10] + fVar28 * local_e8[2] + fVar30 * local_e8[6];
    fVar27 = fVar23 * local_e8[0xb] + fVar28 * local_e8[3] + fVar30 * local_e8[7];
    fVar31 = fVar35 * local_e8[8] + fVar36 * local_e8[0] + fVar16 * local_e8[4];
    fVar32 = fVar35 * local_e8[9] + fVar36 * local_e8[1] + fVar16 * local_e8[5];
    fVar33 = fVar35 * local_e8[10] + fVar36 * local_e8[2] + fVar16 * local_e8[6];
    fVar34 = fVar35 * local_e8[0xb] + fVar36 * local_e8[3] + fVar16 * local_e8[7];
    fVar16 = M->x[0][0];
    fVar17 = M->x[0][1];
    fVar23 = M->x[0][2];
    fVar28 = M->x[0][3];
    fVar29 = M->x[1][0];
    fVar30 = M->x[1][1];
    fVar35 = M->x[1][2];
    fVar36 = M->x[1][3];
    fVar2 = M->x[2][0];
    fVar20 = M->x[2][1];
    fVar3 = M->x[2][2];
    fVar4 = M->x[2][3];
    fVar5 = M->x[3][0];
    fVar6 = M->x[3][1];
    fVar7 = M->x[3][2];
    fVar8 = M->x[3][3];
    local_e8[0] = fVar22 * fVar5 + fVar21 * fVar2 + fVar18 * fVar16 + fVar19 * fVar29;
    local_e8[2] = fVar22 * fVar7 + fVar21 * fVar3 + fVar18 * fVar23 + fVar19 * fVar35;
    local_e8[1] = fVar22 * fVar6 + fVar21 * fVar20 + fVar18 * fVar17 + fVar19 * fVar30;
    local_e8[4] = fVar27 * fVar5 + fVar26 * fVar2 + fVar24 * fVar16 + fVar25 * fVar29;
    local_e8[3] = fVar22 * fVar8 + fVar21 * fVar4 + fVar18 * fVar28 + fVar19 * fVar36;
    local_e8[5] = fVar27 * fVar6 + fVar26 * fVar20 + fVar24 * fVar17 + fVar25 * fVar30;
    local_e8[7] = fVar27 * fVar8 + fVar26 * fVar4 + fVar24 * fVar28 + fVar25 * fVar36;
    local_e8[6] = fVar27 * fVar7 + fVar26 * fVar3 + fVar24 * fVar23 + fVar25 * fVar35;
    local_e8[9] = fVar34 * fVar6 + fVar33 * fVar20 + fVar31 * fVar17 + fVar32 * fVar30;
    local_e8[8] = fVar34 * fVar5 + fVar33 * fVar2 + fVar31 * fVar16 + fVar32 * fVar29;
    local_e8[10] = fVar34 * fVar7 + fVar33 * fVar3 + fVar31 * fVar23 + fVar32 * fVar35;
    fVar19 = local_e8[0xd] * fVar36;
    fVar17 = local_e8[0xc] * fVar17;
    fVar23 = local_e8[0xc] * fVar23;
    fVar18 = local_e8[0xc] * fVar28;
    fVar20 = local_e8[0xe] * fVar20;
    fVar21 = local_e8[0xe] * fVar4;
    local_e8[0xc] =
         local_e8[0xf] * fVar5 +
         local_e8[0xe] * fVar2 + local_e8[0xc] * fVar16 + local_e8[0xd] * fVar29;
    local_e8[0xb] = fVar34 * fVar8 + fVar33 * fVar4 + fVar31 * fVar28 + fVar32 * fVar36;
    local_e8[0xe] = local_e8[0xf] * fVar7 + local_e8[0xe] * fVar3 + fVar23 + local_e8[0xd] * fVar35;
    local_e8[0xd] = local_e8[0xf] * fVar6 + fVar20 + fVar17 + local_e8[0xd] * fVar30;
    local_e8[0xf] = local_e8[0xf] * fVar8 + fVar21 + fVar18 + fVar19;
    fVar16 = *(float *)((long)local_e8 + uVar13 + lVar15 * 0x10);
    fVar17 = *(float *)((long)local_e8 + uVar13 + lVar12);
    fVar16 = fVar16 * fVar16 + fVar17 * fVar17;
    if (fVar16 < 0.0) {
      fVar16 = sqrtf(fVar16);
    }
    else {
      fVar16 = SQRT(fVar16);
    }
    lVar12 = local_88;
    fVar16 = atan2f(fVar16,*(float *)((long)local_e8 + (ulong)uVar14 * 4 + (ulong)(uVar14 << 4)));
    (this->super_Vec3<float>).y = fVar16;
    fVar17 = local_e8[lVar15 * 4 + local_90];
    fVar16 = local_e8[lVar15 * 4 + lVar12];
  }
  fVar16 = atan2f(fVar17,fVar16);
  (this->super_Vec3<float>).z = fVar16;
  bVar1 = this->field_0xc;
  if ((bVar1 & 4) == 0) {
    uVar13._0_4_ = (this->super_Vec3<float>).x;
    uVar13._4_4_ = (this->super_Vec3<float>).y;
    (this->super_Vec3<float>).x = (float)(int)(uVar13 ^ 0x8000000080000000);
    (this->super_Vec3<float>).y = (float)(int)((uVar13 ^ 0x8000000080000000) >> 0x20);
    (this->super_Vec3<float>).z = -(this->super_Vec3<float>).z;
  }
  if ((bVar1 & 1) == 0) {
    fVar16 = (this->super_Vec3<float>).x;
    (this->super_Vec3<float>).x = (this->super_Vec3<float>).z;
    (this->super_Vec3<float>).z = fVar16;
  }
  return;
}

Assistant:

IMATH_HOSTDEVICE void
Euler<T>::extract (const Matrix44<T>& M) IMATH_NOEXCEPT
{
    int i, j, k;
    angleOrder (i, j, k);

    if (_initialRepeated)
    {
        //
        // Extract the first angle, x.
        //

        x = std::atan2 (M[j][i], M[k][i]);

        //
        // Remove the x rotation from M, so that the remaining
        // rotation, N, is only around two axes, and gimbal lock
        // cannot occur.
        //

        Vec3<T> r (0, 0, 0);
        r[i] = (_parityEven ? -x : x);

        Matrix44<T> N;
        N.rotate (r);
        N = N * M;

        //
        // Extract the other two angles, y and z, from N.
        //

        T sy = std::sqrt (N[j][i] * N[j][i] + N[k][i] * N[k][i]);
        y    = std::atan2 (sy, N[i][i]);
        z    = std::atan2 (N[j][k], N[j][j]);
    }
    else
    {
        //
        // Extract the first angle, x.
        //

        x = std::atan2 (M[j][k], M[k][k]);

        //
        // Remove the x rotation from M, so that the remaining
        // rotation, N, is only around two axes, and gimbal lock
        // cannot occur.
        //

        Vec3<T> r (0, 0, 0);
        r[i] = (_parityEven ? -x : x);

        Matrix44<T> N;
        N.rotate (r);
        N = N * M;

        //
        // Extract the other two angles, y and z, from N.
        //

        T cy = std::sqrt (N[i][i] * N[i][i] + N[i][j] * N[i][j]);
        y    = std::atan2 (-N[i][k], cy);
        z    = std::atan2 (-N[j][i], N[j][j]);
    }

    if (!_parityEven) *this *= -1;

    if (!_frameStatic)
    {
        T t = x;
        x   = z;
        z   = t;
    }
}